

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_lex_item_wild(stb_matcher *matcher,char *regex,int result)

{
  bool bVar1;
  ushort local_32;
  char *pcStack_30;
  stb_uint16 end;
  char *z;
  char *pcStack_20;
  int result_local;
  char *regex_local;
  stb_matcher *matcher_local;
  
  z._4_4_ = result;
  pcStack_20 = regex;
  regex_local = (char *)matcher;
  pcStack_30 = stb__wild_parse(matcher,(uint)matcher->start_node,regex,&local_32);
  bVar1 = pcStack_30 != (char *)0x0;
  if (bVar1) {
    stb__lex_reset((stb_matcher *)regex_local);
    *(short *)(*(long *)(regex_local + 0x18) + (long)(int)(uint)local_32 * 0x18) = (short)z._4_4_;
  }
  matcher_local._4_4_ = (uint)bVar1;
  return matcher_local._4_4_;
}

Assistant:

int stb_lex_item_wild(stb_matcher *matcher, char *regex, int result)
{
   char *z;
   stb_uint16 end;

   z = stb__wild_parse(matcher, matcher->start_node, regex, &end);

   if (z == NULL)
      return 0;

   stb__lex_reset(matcher);

   matcher->nodes[(int) end].goal = result;
   return 1;
}